

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::ConcatNode::Print(ConcatNode *this,DebugWriter *w,Char *litbuf)

{
  ConcatNode *local_28;
  ConcatNode *curr;
  Char *litbuf_local;
  DebugWriter *w_local;
  ConcatNode *this_local;
  
  DebugWriter::PrintEOL(w,L"Concat()");
  Node::PrintAnnotations(&this->super_Node,w);
  DebugWriter::PrintEOL(w,L"{");
  DebugWriter::Indent(w);
  for (local_28 = this; local_28 != (ConcatNode *)0x0; local_28 = local_28->tail) {
    (*local_28->head->_vptr_Node[0x16])(local_28->head,w,litbuf);
  }
  DebugWriter::Unindent(w);
  DebugWriter::PrintEOL(w,L"}");
  return;
}

Assistant:

void ConcatNode::Print(DebugWriter* w, const Char* litbuf) const
    {
        w->PrintEOL(_u("Concat()"));
        PrintAnnotations(w);
        w->PrintEOL(_u("{"));
        w->Indent();
        for (const ConcatNode *curr = this; curr != 0; curr = curr->tail)
            curr->head->Print(w, litbuf);
        w->Unindent();
        w->PrintEOL(_u("}"));
    }